

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.c
# Opt level: O0

int read_metadata_buff(WavpackContext *wpc,WavpackMetadata *wpmd)

{
  int iVar1;
  int iVar2;
  uint *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  uint32_t bytes_to_read;
  uchar tchar;
  int local_10;
  byte local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (**(code **)(in_RDI + 0x9b0))(in_RSI + 4,1);
  if (iVar1 != 0) {
    iVar1 = (**(code **)(in_RDI + 0x9b0))(&local_9,1);
    if (iVar1 != 0) {
      *in_RSI = (uint)local_9 << 1;
      if ((in_RSI[4] & 0x80) != 0) {
        *(byte *)(in_RSI + 4) = (byte)in_RSI[4] & 0x7f;
        iVar1 = (**(code **)(in_RDI + 0x9b0))(&local_9,1);
        if (iVar1 == 0) {
          local_10 = 0;
          goto LAB_0021d683;
        }
        *in_RSI = (uint)local_9 * 0x200 + *in_RSI;
        iVar1 = (**(code **)(in_RDI + 0x9b0))(&local_9,1);
        if (iVar1 == 0) {
          local_10 = 0;
          goto LAB_0021d683;
        }
        *in_RSI = (uint)local_9 * 0x20000 + *in_RSI;
      }
      if ((in_RSI[4] & 0x40) != 0) {
        *(byte *)(in_RSI + 4) = (byte)in_RSI[4] & 0xbf;
        *in_RSI = *in_RSI - 1;
      }
      if ((*in_RSI == 0) || (0x400 < *in_RSI)) {
        in_RSI[2] = 0;
        in_RSI[3] = 0;
      }
      else {
        iVar1 = *in_RSI + (*in_RSI & 1);
        iVar2 = (**(code **)(in_RDI + 0x9b0))(in_RDI + 0x560,iVar1);
        if (iVar2 != iVar1) {
          in_RSI[2] = 0;
          in_RSI[3] = 0;
          local_10 = 0;
          goto LAB_0021d683;
        }
        *(long *)(in_RSI + 2) = in_RDI + 0x560;
      }
      local_10 = 1;
      goto LAB_0021d683;
    }
  }
  local_10 = 0;
LAB_0021d683:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

int read_metadata_buff (WavpackContext *wpc, WavpackMetadata *wpmd)
{
    uchar tchar;

    if (!wpc->infile (&wpmd->id, 1) || !wpc->infile (&tchar, 1))
        return FALSE;

    wpmd->byte_length = tchar << 1;

    if (wpmd->id & ID_LARGE) {
        wpmd->id &= ~ID_LARGE;

        if (!wpc->infile (&tchar, 1))
            return FALSE;

        wpmd->byte_length += (int32_t) tchar << 9; 

        if (!wpc->infile (&tchar, 1))
            return FALSE;

        wpmd->byte_length += (int32_t) tchar << 17;
    }

    if (wpmd->id & ID_ODD_SIZE) {
        wpmd->id &= ~ID_ODD_SIZE;
        wpmd->byte_length--;
    }

    if (wpmd->byte_length && wpmd->byte_length <= sizeof (wpc->read_buffer)) {
        uint32_t bytes_to_read = wpmd->byte_length + (wpmd->byte_length & 1);

        if (wpc->infile (wpc->read_buffer, bytes_to_read) != (int32_t) bytes_to_read) {
            wpmd->data = NULL;
            return FALSE;
        }

        wpmd->data = wpc->read_buffer;
    }
    else
        wpmd->data = NULL;

    return TRUE;
}